

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_inertia.cpp
# Opt level: O0

Real Omega_h::inertia::anon_unknown_0::get_half_weight
               (CommPtr *comm,Reals *masses,Read<signed_char> *marked)

{
  LO size_in;
  Real RVar1;
  Write<double> local_f0;
  Read<double> local_e0;
  shared_ptr<Omega_h::Comm> local_d0;
  undefined1 local_c0 [8];
  type f;
  allocator local_79;
  string local_78 [32];
  undefined1 local_58 [8];
  Write<double> weighted;
  LO n;
  Read<signed_char> *marked_local;
  Reals *masses_local;
  CommPtr *comm_local;
  ulong local_10;
  
  if (((ulong)(masses->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((masses->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(masses->write_).shared_alloc_.alloc >> 3;
  }
  size_in = (LO)(local_10 >> 3);
  weighted.shared_alloc_.direct_ptr._4_4_ = size_in;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"",&local_79);
  Write<double>::Write((Write<double> *)local_58,size_in,(string *)local_78);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  Write<double>::Write((Write<double> *)local_c0,(Write<double> *)local_58);
  Read<signed_char>::Read((Read<signed_char> *)&f.weighted.shared_alloc_.direct_ptr,marked);
  Read<double>::Read((Read<double> *)&f.marked.write_.shared_alloc_.direct_ptr,masses);
  parallel_for<Omega_h::inertia::(anonymous_namespace)::get_half_weight(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<signed_char>)::__0>
            (weighted.shared_alloc_.direct_ptr._4_4_,(type *)local_c0,"get_half_weight");
  std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_d0,comm);
  Write<double>::Write(&local_f0,(Write<double> *)local_58);
  Read<double>::Read(&local_e0,&local_f0);
  RVar1 = repro_sum(&local_d0,&local_e0);
  Read<double>::~Read(&local_e0);
  Write<double>::~Write(&local_f0);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_d0);
  (anonymous_namespace)::
  get_half_weight(std::shared_ptr<Omega_h::Comm>,Omega_h::Read<double>,Omega_h::Read<signed_char>)::
  $_0::~__0((__0 *)local_c0);
  Write<double>::~Write((Write<double> *)local_58);
  return RVar1;
}

Assistant:

Real get_half_weight(CommPtr comm, Reals masses, Read<I8> marked) {
  auto n = masses.size();
  Write<Real> weighted(n);
  auto f = OMEGA_H_LAMBDA(LO i) {
    weighted[i] = (Real(marked[i]) * masses[i]);
  };
  parallel_for(n, f, "get_half_weight");
  return repro_sum(comm, Reals(weighted));
}